

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

char * ssh_share_sockname(char *host,int port,Conf *conf)

{
  int iVar1;
  char *local_30;
  char *sockname;
  char *username;
  Conf *conf_local;
  int port_local;
  char *host_local;
  
  sockname = (char *)0x0;
  iVar1 = conf_get_int(conf,2);
  if (iVar1 != 4) {
    sockname = get_remote_username(conf);
  }
  if (port == 0x16) {
    if (sockname == (char *)0x0) {
      local_30 = dupprintf("%s",host);
    }
    else {
      local_30 = dupprintf("%s@%s",sockname,host);
    }
  }
  else if (sockname == (char *)0x0) {
    local_30 = dupprintf("%s:%d",host,(ulong)(uint)port);
  }
  else {
    local_30 = dupprintf("%s@%s:%d",sockname,host,(ulong)(uint)port);
  }
  safefree(sockname);
  return local_30;
}

Assistant:

char *ssh_share_sockname(const char *host, int port, Conf *conf)
{
    char *username = NULL;
    char *sockname;

    /* Include the username we're logging in as in the hash, unless
     * we're using a protocol for which it's completely irrelevant. */
    if (conf_get_int(conf, CONF_protocol) != PROT_SSHCONN)
        username = get_remote_username(conf);

    if (port == 22) {
        if (username)
            sockname = dupprintf("%s@%s", username, host);
        else
            sockname = dupprintf("%s", host);
    } else {
        if (username)
            sockname = dupprintf("%s@%s:%d", username, host, port);
        else
            sockname = dupprintf("%s:%d", host, port);
    }

    sfree(username);
    return sockname;
}